

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall Plan::EdgeFinished(Plan *this,Edge *edge,EdgeResult result,string *err)

{
  bool bVar1;
  pointer ppVar2;
  Pool *pPVar3;
  reference ppNVar4;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_68;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_60;
  iterator o;
  iterator iStack_40;
  bool directly_wanted;
  _Self local_38;
  iterator e;
  string *err_local;
  Edge *pEStack_20;
  EdgeResult result_local;
  Edge *edge_local;
  Plan *this_local;
  
  e._M_node = (_Base_ptr)err;
  pEStack_20 = edge;
  edge_local = (Edge *)this;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
       ::find(&this->want_,&stack0xffffffffffffffe0);
  iStack_40 = std::
              map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
              ::end(&this->want_);
  bVar1 = std::operator!=(&local_38,&stack0xffffffffffffffc0);
  if (!bVar1) {
    __assert_fail("e != want_.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                  ,0x19e,"bool Plan::EdgeFinished(Edge *, EdgeResult, string *)");
  }
  ppVar2 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_>::operator->(&local_38);
  bVar1 = ppVar2->second != kWantNothing;
  if (bVar1) {
    pPVar3 = Edge::pool(pEStack_20);
    Pool::EdgeFinished(pPVar3,pEStack_20);
  }
  pPVar3 = Edge::pool(pEStack_20);
  Pool::RetrieveReadyEdges(pPVar3,&this->ready_);
  if (result == kEdgeSucceeded) {
    if (bVar1) {
      this->wanted_edges_ = this->wanted_edges_ + -1;
    }
    o._M_current = (Node **)std::
                            map<Edge*,Plan::Want,std::less<Edge*>,std::allocator<std::pair<Edge*const,Plan::Want>>>
                            ::erase_abi_cxx11_((map<Edge*,Plan::Want,std::less<Edge*>,std::allocator<std::pair<Edge*const,Plan::Want>>>
                                                *)this,(iterator)local_38._M_node);
    pEStack_20->outputs_ready_ = true;
    local_60._M_current =
         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&pEStack_20->outputs_);
    while( true ) {
      local_68._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&pEStack_20->outputs_);
      bVar1 = __gnu_cxx::operator!=(&local_60,&local_68);
      if (!bVar1) break;
      ppNVar4 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                ::operator*(&local_60);
      bVar1 = NodeFinished(this,*ppNVar4,(string *)e._M_node);
      if (!bVar1) {
        return false;
      }
      __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
      operator++(&local_60);
    }
  }
  return true;
}

Assistant:

bool Plan::EdgeFinished(Edge* edge, EdgeResult result, string* err) {
  map<Edge*, Want>::iterator e = want_.find(edge);
  assert(e != want_.end());
  bool directly_wanted = e->second != kWantNothing;

  // See if this job frees up any delayed jobs.
  if (directly_wanted)
    edge->pool()->EdgeFinished(*edge);
  edge->pool()->RetrieveReadyEdges(&ready_);

  // The rest of this function only applies to successful commands.
  if (result != kEdgeSucceeded)
    return true;

  if (directly_wanted)
    --wanted_edges_;
  want_.erase(e);
  edge->outputs_ready_ = true;

  // Check off any nodes we were waiting for with this edge.
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (!NodeFinished(*o, err))
      return false;
  }
  return true;
}